

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLock.cxx
# Opt level: O3

void __thiscall cmFileLock::cmFileLock(cmFileLock *this,cmFileLock *other)

{
  this->File = -1;
  (this->Filename)._M_dataplus._M_p = (pointer)&(this->Filename).field_2;
  (this->Filename)._M_string_length = 0;
  (this->Filename).field_2._M_local_buf[0] = '\0';
  this->File = other->File;
  other->File = -1;
  std::__cxx11::string::operator=((string *)&this->Filename,(string *)&other->Filename);
  return;
}

Assistant:

cmFileLock::cmFileLock(cmFileLock&& other) noexcept
{
  this->File = other.File;
#if defined(_WIN32)
  other.File = INVALID_HANDLE_VALUE;
#else
  other.File = -1;
#endif
  this->Filename = std::move(other.Filename);
}